

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkFromMappedGia(Gia_Man_t *p,int fFindEnables,int fUseBuffs)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  Abc_Ntk_t *pAVar9;
  char *pcVar10;
  Abc_Obj_t *pAVar11;
  Abc_Obj_t *pAVar12;
  Abc_Obj_t *pAVar13;
  Abc_Obj_t *pObj;
  ulong uVar14;
  Vec_Ptr_t *vCopies;
  void **__s;
  Hop_Obj_t *pHVar15;
  Vec_Int_t *pVVar16;
  uint uVar17;
  Gia_Obj_t *pGVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  Abc_Ntk_t *pAVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  uint *puVar28;
  int iLitT;
  int iLitE;
  uint local_50;
  uint local_4c;
  Abc_Ntk_t *local_48;
  int local_40;
  int local_3c;
  Abc_Obj_t *local_38;
  
  if (((p->vMapping == (Vec_Int_t *)0x0) && (fFindEnables == 0)) && (p->pMuxes == (uint *)0x0)) {
    __assert_fail("Gia_ManHasMapping(p) || p->pMuxes || fFindEnables",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x2ea,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
  }
  local_40 = fFindEnables;
  if ((fFindEnables != 0) && (p->pMuxes != (uint *)0x0)) {
    __assert_fail("!fFindEnables || !p->pMuxes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x2eb,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
  }
  local_3c = fUseBuffs;
  pAVar9 = Abc_NtkAlloc(ABC_NTK_LOGIC,(uint)(p->vMapping != (Vec_Int_t *)0x0) * 2 + ABC_FUNC_SOP,1);
  pcVar10 = Extra_UtilStrsav(p->pName);
  pAVar9->pName = pcVar10;
  pcVar10 = Extra_UtilStrsav(p->pSpec);
  pAVar9->pSpec = pcVar10;
  Gia_ManFillValue(p);
  local_38 = Abc_NtkCreateNodeConst0(pAVar9);
  p->pObjs->Value = local_38->Id;
  iVar8 = p->nRegs;
  pVVar16 = p->vCis;
  iVar25 = pVVar16->nSize;
  if (iVar8 < iVar25) {
    lVar23 = 0;
    do {
      if (iVar25 <= lVar23) goto LAB_002a6a13;
      iVar25 = pVVar16->pArray[lVar23];
      if (((long)iVar25 < 0) || (p->nObjs <= iVar25)) goto LAB_002a69f4;
      pGVar18 = p->pObjs;
      if (pGVar18 == (Gia_Obj_t *)0x0) break;
      pAVar11 = Abc_NtkCreateObj(pAVar9,ABC_OBJ_PI);
      pGVar18[iVar25].Value = pAVar11->Id;
      lVar23 = lVar23 + 1;
      iVar8 = p->nRegs;
      pVVar16 = p->vCis;
      iVar25 = pVVar16->nSize;
    } while (lVar23 < iVar25 - iVar8);
  }
  pVVar16 = p->vCos;
  iVar25 = pVVar16->nSize;
  if (iVar8 < iVar25) {
    lVar23 = 0;
    do {
      if (iVar25 <= lVar23) goto LAB_002a6a13;
      iVar25 = pVVar16->pArray[lVar23];
      if (((long)iVar25 < 0) || (p->nObjs <= iVar25)) goto LAB_002a69f4;
      pGVar18 = p->pObjs;
      if (pGVar18 == (Gia_Obj_t *)0x0) break;
      pAVar11 = Abc_NtkCreateObj(pAVar9,ABC_OBJ_PO);
      pGVar18[iVar25].Value = pAVar11->Id;
      lVar23 = lVar23 + 1;
      iVar8 = p->nRegs;
      pVVar16 = p->vCos;
      iVar25 = pVVar16->nSize;
    } while (lVar23 < iVar25 - iVar8);
  }
  local_48 = pAVar9;
  if (0 < iVar8) {
    iVar25 = 0;
    do {
      pAVar9 = local_48;
      iVar2 = p->vCos->nSize;
      uVar19 = (iVar2 - iVar8) + iVar25;
      if (((int)uVar19 < 0) || (iVar2 <= (int)uVar19)) goto LAB_002a6a13;
      iVar2 = p->vCos->pArray[uVar19];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_002a69f4;
      pGVar18 = p->pObjs;
      if (pGVar18 == (Gia_Obj_t *)0x0) break;
      iVar3 = p->vCis->nSize;
      uVar19 = (iVar3 - iVar8) + iVar25;
      if (((int)uVar19 < 0) || (iVar3 <= (int)uVar19)) goto LAB_002a6a13;
      uVar19 = p->vCis->pArray[uVar19];
      if (((long)(int)uVar19 < 0) || ((uint)p->nObjs <= uVar19)) goto LAB_002a69f4;
      pAVar11 = Abc_NtkCreateObj(local_48,ABC_OBJ_LATCH);
      pAVar12 = Abc_NtkCreateObj(pAVar9,ABC_OBJ_BI);
      pAVar13 = Abc_NtkCreateObj(pAVar9,ABC_OBJ_BO);
      Abc_ObjAddFanin(pAVar11,pAVar12);
      Abc_ObjAddFanin(pAVar13,pAVar11);
      pGVar18[iVar2].Value = pAVar12->Id;
      pGVar18[(int)uVar19].Value = pAVar13->Id;
      if ((*(uint *)&pAVar11->field_0x14 & 0xf) != 8) {
        __assert_fail("Abc_ObjIsLatch(pLatch)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                      ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
      }
      pAVar11->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
      iVar25 = iVar25 + 1;
      iVar8 = p->nRegs;
    } while (iVar25 < iVar8);
  }
  if (local_40 == 0) {
    iVar8 = p->nObjs;
    if (p->pMuxes == (uint *)0x0) {
      vCopies = (Vec_Ptr_t *)malloc(0x10);
      iVar25 = 8;
      if (6 < iVar8 - 1U) {
        iVar25 = iVar8;
      }
      vCopies->nCap = iVar25;
      if (iVar25 == 0) {
        __s = (void **)0x0;
      }
      else {
        __s = (void **)malloc((long)iVar25 << 3);
      }
      vCopies->pArray = __s;
      vCopies->nSize = iVar8;
      memset(__s,0,(long)iVar8 << 3);
      if (1 < iVar8) {
        lVar23 = 1;
        do {
          pAVar9 = local_48;
          uVar19 = p->vMapping->nSize;
          if ((int)uVar19 <= lVar23) goto LAB_002a6a13;
          piVar6 = p->vMapping->pArray;
          uVar20 = piVar6[lVar23];
          if ((ulong)uVar20 != 0) {
            if (p->pObjs[lVar23].Value != 0xffffffff) {
              __assert_fail("pObj->Value == ~0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                            ,0x353,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
            }
            if (((int)uVar20 < 0) || (uVar19 <= uVar20)) goto LAB_002a6a13;
            puVar28 = &p->pObjs[lVar23].Value;
            if (piVar6[uVar20] == 0) {
              *puVar28 = local_38->Id;
            }
            else {
              pAVar11 = Abc_NtkCreateObj(local_48,ABC_OBJ_NODE);
              pVVar16 = p->vMapping;
              lVar27 = (long)pVVar16->nSize;
              if (lVar27 <= lVar23) goto LAB_002a6a13;
              lVar26 = 0;
              while( true ) {
                piVar6 = pVVar16->pArray;
                lVar22 = (long)piVar6[lVar23];
                if ((lVar22 < 0) || ((uint)lVar27 <= (uint)piVar6[lVar23])) goto LAB_002a6a13;
                if (piVar6[lVar22] <= lVar26) break;
                iVar8 = piVar6[lVar22 + lVar26 + 1];
                if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_002a69f4;
                uVar19 = p->pObjs[iVar8].Value;
                if (((long)(int)uVar19 < 0) ||
                   (pVVar7 = pAVar9->vObjs, pVVar7->nSize <= (int)uVar19)) goto LAB_002a6a32;
                Abc_ObjAddFanin(pAVar11,(Abc_Obj_t *)pVVar7->pArray[(int)uVar19]);
                lVar26 = lVar26 + 1;
                pVVar16 = p->vMapping;
                lVar27 = (long)pVVar16->nSize;
                if (lVar27 <= lVar23) goto LAB_002a6a13;
              }
              pHVar15 = Abc_ObjHopFromGia((Hop_Man_t *)pAVar9->pManFunc,p,(int)lVar23,vCopies);
              (pAVar11->field_5).pData = pHVar15;
              *puVar28 = pAVar11->Id;
              iVar8 = p->nObjs;
            }
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 < iVar8);
        __s = vCopies->pArray;
      }
      if (__s != (void **)0x0) {
        free(__s);
      }
      free(vCopies);
      goto LAB_002a687a;
    }
    if (0 < iVar8) {
      lVar23 = 0;
      lVar27 = 0;
      do {
        pAVar9 = local_48;
        pGVar18 = p->pObjs;
        if (pGVar18 == (Gia_Obj_t *)0x0) break;
        pGVar1 = (Gia_Obj_t *)(&pGVar18->field_0x0 + lVar23);
        if ((~*(uint *)pGVar1 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar1) {
          pAVar11 = Abc_NtkCreateObj(local_48,ABC_OBJ_NODE);
          puVar28 = p->pMuxes;
          if ((puVar28 == (uint *)0x0) || (puVar28[lVar27] == 0)) {
            uVar14 = *(ulong *)pGVar1;
            iVar8 = (int)(uVar14 & 0x1fffffff);
            if (((uVar14 & 0x1fffffff) == 0x1fffffff || (int)(uint)uVar14 < 0) ||
               (((uint)(uVar14 >> 0x20) & 0x1fffffff) <= ((uint)uVar14 & 0x1fffffff))) {
              iVar8 = *(int *)((long)pGVar18 + lVar23 + (ulong)(uint)(iVar8 << 2) * -3 + 8);
              if (((long)iVar8 < 0) || (pAVar9->vObjs->nSize <= iVar8)) goto LAB_002a6a32;
              Abc_ObjAddFanin(pAVar11,(Abc_Obj_t *)pAVar9->vObjs->pArray[iVar8]);
              iVar8 = *(int *)((long)pGVar1 +
                              (ulong)((*(uint *)(&pGVar18->field_0x4 + lVar23) & 0x1fffffff) << 2) *
                              -3 + 8);
              if (((long)iVar8 < 0) || (pAVar9->vObjs->nSize <= iVar8)) goto LAB_002a6a32;
              Abc_ObjAddFanin(pAVar11,(Abc_Obj_t *)pAVar9->vObjs->pArray[iVar8]);
              pcVar10 = Abc_SopCreateAnd((Mem_Flex_t *)pAVar9->pManFunc,2,(int *)0x0);
            }
            else {
              iVar8 = *(int *)((long)pGVar18 + lVar23 + (ulong)(uint)(iVar8 << 2) * -3 + 8);
              if (((long)iVar8 < 0) || (pAVar9->vObjs->nSize <= iVar8)) goto LAB_002a6a32;
              Abc_ObjAddFanin(pAVar11,(Abc_Obj_t *)pAVar9->vObjs->pArray[iVar8]);
              iVar8 = *(int *)((long)pGVar1 +
                              (ulong)((*(uint *)(&pGVar18->field_0x4 + lVar23) & 0x1fffffff) << 2) *
                              -3 + 8);
              if (((long)iVar8 < 0) || (pAVar9->vObjs->nSize <= iVar8)) goto LAB_002a6a32;
              Abc_ObjAddFanin(pAVar11,(Abc_Obj_t *)pAVar9->vObjs->pArray[iVar8]);
              pcVar10 = Abc_SopCreateXor((Mem_Flex_t *)pAVar9->pManFunc,2);
            }
            (pAVar11->field_5).pData = pcVar10;
            uVar14 = *(ulong *)pGVar1;
            if (((uint)uVar14 >> 0x1d & 1) != 0) {
              Abc_SopComplementVar(pcVar10,0);
              uVar14 = *(ulong *)pGVar1;
            }
            if ((uVar14 & 0x2000000000000000) != 0) {
              iVar8 = 1;
              goto LAB_002a6656;
            }
          }
          else {
            pGVar5 = p->pObjs;
            if ((pGVar1 < pGVar5) || (pGVar5 + p->nObjs <= pGVar1)) goto LAB_002a6a51;
            if ((int)puVar28[(int)((ulong)((long)pGVar18 + (lVar23 - (long)pGVar5)) >> 2) *
                             -0x55555555] < 0) goto LAB_002a6acd;
            uVar19 = puVar28[(int)((ulong)((long)pGVar18 + (lVar23 - (long)pGVar5)) >> 2) *
                             -0x55555555] >> 1;
            if (p->nObjs <= (int)uVar19) goto LAB_002a69f4;
            uVar19 = pGVar5[uVar19].Value;
            if (((long)(int)uVar19 < 0) || (pAVar9->vObjs->nSize <= (int)uVar19)) goto LAB_002a6a32;
            Abc_ObjAddFanin(pAVar11,(Abc_Obj_t *)pAVar9->vObjs->pArray[(int)uVar19]);
            iVar8 = *(int *)((long)pGVar1 +
                            (ulong)((*(uint *)(&pGVar18->field_0x4 + lVar23) & 0x1fffffff) << 2) *
                            -3 + 8);
            if (((long)iVar8 < 0) || (pAVar9->vObjs->nSize <= iVar8)) goto LAB_002a6a32;
            Abc_ObjAddFanin(pAVar11,(Abc_Obj_t *)pAVar9->vObjs->pArray[iVar8]);
            iVar8 = *(int *)((long)pGVar1 +
                            (ulong)((*(uint *)(&pGVar18->field_0x0 + lVar23) & 0x1fffffff) << 2) *
                            -3 + 8);
            if (((long)iVar8 < 0) || (pAVar9->vObjs->nSize <= iVar8)) goto LAB_002a6a32;
            Abc_ObjAddFanin(pAVar11,(Abc_Obj_t *)pAVar9->vObjs->pArray[iVar8]);
            pcVar10 = Abc_SopCreateMux((Mem_Flex_t *)pAVar9->pManFunc);
            (pAVar11->field_5).pData = pcVar10;
            if (p->pMuxes != (uint *)0x0) {
              pGVar5 = p->pObjs;
              if ((pGVar1 < pGVar5) || (pGVar5 + p->nObjs <= pGVar1)) goto LAB_002a6a51;
              uVar19 = p->pMuxes[(int)((ulong)((long)pGVar18 + (lVar23 - (long)pGVar5)) >> 2) *
                                 -0x55555555];
              if ((int)uVar19 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x130,"int Abc_LitIsCompl(int)");
              }
              if ((uVar19 & 1) != 0) {
                Abc_SopComplementVar(pcVar10,0);
              }
            }
            uVar14 = *(ulong *)pGVar1;
            if ((uVar14 & 0x2000000000000000) != 0) {
              Abc_SopComplementVar((char *)(pAVar11->field_5).pData,1);
              uVar14 = *(ulong *)pGVar1;
            }
            iVar8 = 2;
            if (((uint)uVar14 >> 0x1d & 1) != 0) {
LAB_002a6656:
              Abc_SopComplementVar((char *)(pAVar11->field_5).pData,iVar8);
            }
          }
          *(int *)((long)&pGVar18->Value + lVar23) = pAVar11->Id;
          iVar8 = p->nObjs;
        }
        lVar27 = lVar27 + 1;
        lVar23 = lVar23 + 0xc;
      } while (lVar27 < iVar8);
      goto LAB_002a687a;
    }
  }
  else {
    pVVar16 = p->vCos;
    uVar14 = (ulong)(uint)pVVar16->nSize;
    if (pVVar16->nSize < 1) goto LAB_002a6942;
    lVar23 = 0;
    do {
      pAVar9 = local_48;
      iVar8 = pVVar16->pArray[lVar23];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_002a69f4;
      pGVar18 = p->pObjs;
      if (pGVar18 == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGVar18 + iVar8;
      uVar4 = *(ulong *)pGVar1;
      if (((uVar4 & 0x1fffffff) == 0x1fffffff || -1 < (int)uVar4) ||
         ((int)((uint)(uVar4 >> 0x20) & 0x1fffffff) < (int)uVar14 - p->nRegs)) {
LAB_002a61f8:
        if ((pGVar1 < pGVar18) || (pGVar18 + p->nObjs <= pGVar1)) goto LAB_002a6a51;
        pObj = Abc_NtkFromMappedGia_rec
                         (pAVar9,p,(int)((ulong)((long)pGVar1 - (long)pGVar18) >> 2) * -0x55555555 -
                                   (*(uint *)pGVar1 & 0x1fffffff),*(uint *)pGVar1 >> 0x1d & 1);
      }
      else {
        iVar8 = Gia_ObjIsMuxType(pGVar1 + -(uVar4 & 0x1fffffff));
        pGVar18 = p->pObjs;
        if (iVar8 == 0) goto LAB_002a61f8;
        if ((pGVar1 < pGVar18) || (uVar19 = p->nObjs, pGVar18 + (int)uVar19 <= pGVar1)) {
LAB_002a6a51:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar20 = (int)((long)pGVar1 - (long)pGVar18 >> 2) * -0x55555555;
        if (((int)uVar20 < 0) || ((int)uVar19 <= (int)uVar20)) goto LAB_002a69f4;
        uVar21 = (uint)*(undefined8 *)(pGVar18 + (uVar20 & 0x7fffffff));
        if ((-1 < (int)uVar21) || ((uVar21 & 0x1fffffff) == 0x1fffffff)) {
LAB_002a6a8f:
          __assert_fail("Gia_ObjIsRi(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1fe,"Gia_Obj_t *Gia_ObjRiToRo(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar20 = (uint)((ulong)*(undefined8 *)(pGVar18 + (uVar20 & 0x7fffffff)) >> 0x20) &
                 0x1fffffff;
        iVar8 = p->vCos->nSize;
        if ((int)uVar20 < iVar8 - p->nRegs) goto LAB_002a6a8f;
        iVar25 = p->vCis->nSize;
        uVar20 = (iVar25 - iVar8) + uVar20;
        if (((int)uVar20 < 0) || (iVar25 <= (int)uVar20)) {
LAB_002a6a13:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar20 = p->vCis->pArray[uVar20];
        if (((int)uVar20 < 0) || (uVar19 <= uVar20)) goto LAB_002a69f4;
        uVar19 = Gia_ObjRecognizeMuxLits
                           (p,pGVar1 + -(ulong)((uint)*(ulong *)pGVar1 & 0x1fffffff),
                            (int *)&local_50,(int *)&local_4c);
        if ((int)local_4c < 0) {
LAB_002a6aae:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar17 = *(uint *)pGVar1 >> 0x1d & 1;
        uVar21 = local_4c ^ uVar17;
        local_4c = uVar21;
        if ((int)local_50 < 0) goto LAB_002a6aae;
        local_4c = uVar17 ^ local_50;
        uVar17 = local_50 >> 1;
        local_50 = local_4c;
        if (uVar17 == uVar20) {
          local_50 = uVar21;
          if ((int)uVar19 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          uVar19 = uVar19 ^ 1;
          uVar21 = local_4c;
        }
        local_4c = uVar21;
        if (uVar21 >> 1 != uVar20) {
          pGVar18 = p->pObjs;
          goto LAB_002a61f8;
        }
        if ((((int)uVar19 < 0) ||
            (pAVar11 = Abc_NtkFromMappedGia_rec(pAVar9,p,uVar19 >> 1,uVar19 & 1), (int)local_50 < 0)
            ) || (pAVar12 = Abc_NtkFromMappedGia_rec(pAVar9,p,local_50 >> 1,local_50 & 1),
                 (int)local_4c < 0)) {
LAB_002a6acd:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        pAVar13 = Abc_NtkFromMappedGia_rec(pAVar9,p,local_4c >> 1,local_4c & 1);
        pObj = Abc_NtkCreateObj(pAVar9,ABC_OBJ_NODE);
        Abc_ObjAddFanin(pObj,pAVar11);
        Abc_ObjAddFanin(pObj,pAVar12);
        Abc_ObjAddFanin(pObj,pAVar13);
        pcVar10 = Abc_SopCreateMux((Mem_Flex_t *)pAVar9->pManFunc);
        (pObj->field_5).pData = pcVar10;
      }
      if (pAVar9->vCos->nSize <= lVar23) goto LAB_002a6a32;
      Abc_ObjAddFanin((Abc_Obj_t *)pAVar9->vCos->pArray[lVar23],pObj);
      lVar23 = lVar23 + 1;
      pVVar16 = p->vCos;
      uVar14 = (ulong)pVVar16->nSize;
    } while (lVar23 < (long)uVar14);
LAB_002a687a:
    if (local_40 != 0) goto LAB_002a6942;
  }
  pVVar16 = p->vCos;
  if (0 < pVVar16->nSize) {
    lVar23 = 0;
    do {
      iVar8 = pVVar16->pArray[lVar23];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
LAB_002a69f4:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar18 = p->pObjs + iVar8;
      uVar20 = (uint)*(undefined8 *)pGVar18;
      uVar19 = pGVar18[-(ulong)(uVar20 & 0x1fffffff)].Value;
      if ((((long)(int)uVar19 < 0) || (local_48->vObjs->nSize <= (int)uVar19)) ||
         (local_48->vCos->nSize <= lVar23)) {
LAB_002a6a32:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Abc_ObjAddFanin((Abc_Obj_t *)local_48->vCos->pArray[lVar23],
                      (Abc_Obj_t *)
                      ((ulong)(uVar20 >> 0x1d & 1) ^ (ulong)local_48->vObjs->pArray[(int)uVar19]));
      lVar23 = lVar23 + 1;
      pVVar16 = p->vCos;
    } while (lVar23 < pVVar16->nSize);
  }
LAB_002a6942:
  pAVar9 = local_48;
  Abc_NtkAddDummyPiNames(local_48);
  Abc_NtkAddDummyPoNames(pAVar9);
  Abc_NtkAddDummyBoxNames(pAVar9);
  Abc_NtkLogicMakeSimpleCos(pAVar9,(uint)(local_3c == 0));
  if (((local_38->field_0x14 & 0xf) != 0) && ((local_38->vFanouts).nSize == 0)) {
    Abc_NtkDeleteObj(local_38);
  }
  iVar8 = p->nRegs;
  if (p->vCis->nSize - iVar8 != pAVar9->vPis->nSize) {
    __assert_fail("Gia_ManPiNum(p) == Abc_NtkPiNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x37c,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
  }
  if (p->vCos->nSize - iVar8 != pAVar9->vPos->nSize) {
    __assert_fail("Gia_ManPoNum(p) == Abc_NtkPoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x37d,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
  }
  if (iVar8 != pAVar9->nObjCounts[8]) {
    __assert_fail("Gia_ManRegNum(p) == Abc_NtkLatchNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x37e,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
  }
  pAVar24 = pAVar9;
  iVar8 = Abc_NtkCheck(pAVar9);
  if (iVar8 == 0) {
    Abc_Print((int)pAVar24,"Abc_NtkFromMappedGia(): Network check has failed.\n");
  }
  return pAVar9;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromMappedGia( Gia_Man_t * p, int fFindEnables, int fUseBuffs )
{
    int fVerbose = 0;
    int fDuplicate = 0;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObjNew, * pObjNewLi, * pObjNewLo, * pConst0 = NULL;
    Gia_Obj_t * pObj, * pObjLi, * pObjLo;
    Vec_Ptr_t * vReflect;
    int i, k, iFan, nDupGates, nCountMux = 0; 
    assert( Gia_ManHasMapping(p) || p->pMuxes || fFindEnables );
    assert( !fFindEnables || !p->pMuxes );
    pNtkNew = Abc_NtkAlloc( ABC_NTK_LOGIC, Gia_ManHasMapping(p) ? ABC_FUNC_AIG : ABC_FUNC_SOP, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(p->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(p->pSpec);
    Gia_ManFillValue( p );
    // create constant
    pConst0 = Abc_NtkCreateNodeConst0( pNtkNew );
    Gia_ManConst0(p)->Value = Abc_ObjId(pConst0);
    // create PIs
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Abc_ObjId( Abc_NtkCreatePi( pNtkNew ) );
    // create POs
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Abc_ObjId( Abc_NtkCreatePo( pNtkNew ) );
    // create as many latches as there are registers in the manager
    Gia_ManForEachRiRo( p, pObjLi, pObjLo, i )
    {
        pObjNew = Abc_NtkCreateLatch( pNtkNew );
        pObjNewLi = Abc_NtkCreateBi( pNtkNew );
        pObjNewLo = Abc_NtkCreateBo( pNtkNew );
        Abc_ObjAddFanin( pObjNew, pObjNewLi );
        Abc_ObjAddFanin( pObjNewLo, pObjNew );
        pObjLi->Value = Abc_ObjId( pObjNewLi );
        pObjLo->Value = Abc_ObjId( pObjNewLo );
        Abc_LatchSetInit0( pObjNew );
    }
    // rebuild the AIG
    if ( fFindEnables )
    {
        Gia_ManForEachCo( p, pObj, i )
        {
            pObjNew = NULL;
            if ( Gia_ObjIsRi(p, pObj) && Gia_ObjIsMuxType(Gia_ObjFanin0(pObj)) )
            {
                int iObjRo = Gia_ObjRiToRoId( p, Gia_ObjId(p, pObj) );
                int iLitE, iLitT, iCtrl = Gia_ObjRecognizeMuxLits( p, Gia_ObjFanin0(pObj), &iLitT, &iLitE );
                iLitE = Abc_LitNotCond( iLitE, Gia_ObjFaninC0(pObj) );
                iLitT = Abc_LitNotCond( iLitT, Gia_ObjFaninC0(pObj) );
                if ( Abc_Lit2Var(iLitT) == iObjRo )
                {
                    int iTemp = iLitE;
                    iLitE = iLitT;
                    iLitT = iTemp;
                    iCtrl = Abc_LitNot( iCtrl );
                }
                if ( Abc_Lit2Var(iLitE) == iObjRo )
                {
                    Abc_Obj_t * pObjCtrl  = Abc_NtkFromMappedGia_rec( pNtkNew, p, Abc_Lit2Var(iCtrl), Abc_LitIsCompl(iCtrl) );
                    Abc_Obj_t * pObjNodeT = Abc_NtkFromMappedGia_rec( pNtkNew, p, Abc_Lit2Var(iLitT), Abc_LitIsCompl(iLitT) );
                    Abc_Obj_t * pObjNodeE = Abc_NtkFromMappedGia_rec( pNtkNew, p, Abc_Lit2Var(iLitE), Abc_LitIsCompl(iLitE) );
                    pObjNew = Abc_NtkCreateNode( pNtkNew );
                    Abc_ObjAddFanin( pObjNew, pObjCtrl );
                    Abc_ObjAddFanin( pObjNew, pObjNodeT );
                    Abc_ObjAddFanin( pObjNew, pObjNodeE );
                    pObjNew->pData = Abc_SopCreateMux( (Mem_Flex_t *)pNtkNew->pManFunc );
                    nCountMux++;
                }
            }
            if ( pObjNew == NULL )
                pObjNew = Abc_NtkFromMappedGia_rec( pNtkNew, p, Gia_ObjFaninId0p(p, pObj), Gia_ObjFaninC0(pObj) );
            Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), pObjNew );
        }
    }
    else if ( p->pMuxes )
    {
        Gia_ManForEachAnd( p, pObj, i )
        {
            pObjNew = Abc_NtkCreateNode( pNtkNew );
            if ( Gia_ObjIsMuxId(p, i) )
            {
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin2(p, pObj))) );
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin1(pObj))) );
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin0(pObj))) );
                pObjNew->pData = Abc_SopCreateMux( (Mem_Flex_t *)pNtkNew->pManFunc );
                if ( Gia_ObjFaninC2(p, pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 0 );
                if ( Gia_ObjFaninC1(pObj) )     Abc_SopComplementVar( (char *)pObjNew->pData, 1 );
                if ( Gia_ObjFaninC0(pObj) )     Abc_SopComplementVar( (char *)pObjNew->pData, 2 );
            }
            else if ( Gia_ObjIsXor(pObj) )
            {
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin0(pObj))) );
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin1(pObj))) );
                pObjNew->pData = Abc_SopCreateXor( (Mem_Flex_t *)pNtkNew->pManFunc, 2 );
                if ( Gia_ObjFaninC0(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 0 );
                if ( Gia_ObjFaninC1(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 1 );
            }
            else 
            {
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin0(pObj))) );
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin1(pObj))) );
                pObjNew->pData = Abc_SopCreateAnd( (Mem_Flex_t *)pNtkNew->pManFunc, 2, NULL );
                if ( Gia_ObjFaninC0(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 0 );
                if ( Gia_ObjFaninC1(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 1 );
            }
            pObj->Value = Abc_ObjId( pObjNew );
        }
    }
    else
    {
        vReflect = Vec_PtrStart( Gia_ManObjNum(p) );
        Gia_ManForEachLut( p, i )
        {
            pObj = Gia_ManObj(p, i);
            assert( pObj->Value == ~0 );
            if ( Gia_ObjLutSize(p, i) == 0 )
            {
                pObj->Value = Abc_ObjId(pConst0);
                continue;
            }
            pObjNew = Abc_NtkCreateNode( pNtkNew );
            Gia_LutForEachFanin( p, i, iFan, k )
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ManObj(p, iFan))) );
            pObjNew->pData = Abc_ObjHopFromGia( (Hop_Man_t *)pNtkNew->pManFunc, p, i, vReflect );
            pObj->Value = Abc_ObjId( pObjNew );
        }
        Vec_PtrFree( vReflect );
    }
    //if ( fFindEnables )
    //    printf( "Extracted %d flop enable signals.\n", nCountMux );
    // connect the PO nodes
    if ( !fFindEnables )
    Gia_ManForEachCo( p, pObj, i )
    {
        pObjNew = Abc_NtkObj( pNtkNew, Gia_ObjValue(Gia_ObjFanin0(pObj)) );
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), Abc_ObjNotCond( pObjNew, Gia_ObjFaninC0(pObj) ) );
    }
    // create names
    Abc_NtkAddDummyPiNames( pNtkNew );
    Abc_NtkAddDummyPoNames( pNtkNew );
    Abc_NtkAddDummyBoxNames( pNtkNew );

    // decouple the PO driver nodes to reduce the number of levels
    nDupGates = Abc_NtkLogicMakeSimpleCos( pNtkNew, !fUseBuffs );
    if ( fVerbose && nDupGates && !Abc_FrameReadFlag("silentmode") )
    {
        if ( !fDuplicate )
            printf( "Added %d buffers/inverters to decouple the CO drivers.\n", nDupGates );
        else
            printf( "Duplicated %d gates to decouple the CO drivers.\n", nDupGates );
    }
    // remove const node if it is not used
    if ( !Abc_ObjIsNone(pConst0) && Abc_ObjFanoutNum(pConst0) == 0 )
        Abc_NtkDeleteObj( pConst0 );

    assert( Gia_ManPiNum(p) == Abc_NtkPiNum(pNtkNew) );
    assert( Gia_ManPoNum(p) == Abc_NtkPoNum(pNtkNew) );
    assert( Gia_ManRegNum(p) == Abc_NtkLatchNum(pNtkNew) );

    // check the resulting AIG
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkFromMappedGia(): Network check has failed.\n" );
    return pNtkNew;
}